

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O0

void __thiscall
wasm::AvoidReinterprets::optimize(wasm::Function*)::FinalOptimizer::visitLoad(wasm::Load__
          (void *this,Load *curr)

{
  Index index;
  _Base_ptr value;
  iterator load;
  bool bVar1;
  pointer ppVar2;
  Module *this_00;
  Memory *pMVar3;
  _Base_ptr p_Var4;
  LocalGet *ptr_00;
  Load *value_00;
  Block *expression;
  LocalSet *local_90;
  LocalSet *local_88;
  _Base_ptr local_80;
  initializer_list<wasm::Expression_*> local_78;
  uintptr_t local_68;
  Type local_60;
  Type indexType;
  Memory *mem;
  Expression *ptr;
  Builder builder;
  Info *info;
  _Self local_20;
  iterator iter;
  Load *curr_local;
  FinalOptimizer *this_local;
  
  iter._M_node = (_Base_ptr)curr;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
       ::find(*(map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
                **)((long)this + 0xd8),(key_type *)&iter);
  info = (Info *)std::
                 map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
                 ::end(*(map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
                         **)((long)this + 0xd8));
  bVar1 = std::operator!=(&local_20,(_Self *)&info);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>::
             operator->(&local_20);
    builder.wasm = (Module *)&ppVar2->second;
    Builder::Builder((Builder *)&ptr,*(Module **)((long)this + 0xe8));
    value = iter._M_node[1]._M_left;
    this_00 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                        ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
    indexType.id = (uintptr_t)iter._M_node[1]._M_right;
    pMVar3 = Module::getMemory(this_00,(IString)*(IString *)&iter._M_node[1]._M_right);
    local_68 = (pMVar3->indexType).id;
    local_60.id = local_68;
    p_Var4 = (_Base_ptr)
             Builder::makeLocalGet
                       ((Builder *)&ptr,
                        *(Index *)((long)&((builder.wasm)->exports).
                                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4),
                        (Type)local_68);
    iter._M_node[1]._M_left = p_Var4;
    local_90 = Builder::makeLocalSet
                         ((Builder *)&ptr,
                          *(Index *)((long)&((builder.wasm)->exports).
                                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 4),
                          (Expression *)value);
    load = iter;
    index = *(Index *)&((builder.wasm)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    ptr_00 = Builder::makeLocalGet
                       ((Builder *)&ptr,
                        *(Index *)((long)&((builder.wasm)->exports).
                                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4),local_60);
    value_00 = makeReinterpretedLoad(wasm::Load*,wasm::Expression__
                         (this,(Load *)load._M_node,(Expression *)ptr_00);
    local_88 = Builder::makeLocalSet((Builder *)&ptr,index,(Expression *)value_00);
    local_80 = iter._M_node;
    local_78._M_array = (iterator)&local_90;
    local_78._M_len = 3;
    expression = Builder::makeBlock((Builder *)&ptr,&local_78);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
               (Expression *)expression);
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
        auto iter = infos.find(curr);
        if (iter != infos.end()) {
          auto& info = iter->second;
          Builder builder(*module);
          auto* ptr = curr->ptr;
          auto mem = getModule()->getMemory(curr->memory);
          auto indexType = mem->indexType;
          curr->ptr = builder.makeLocalGet(info.ptrLocal, indexType);
          // Note that the other load can have its sign set to false - if the
          // original were an integer, the other is a float anyhow; and if
          // original were a float, we don't know what sign to use.
          replaceCurrent(builder.makeBlock(
            {builder.makeLocalSet(info.ptrLocal, ptr),
             builder.makeLocalSet(
               info.reinterpretedLocal,
               makeReinterpretedLoad(
                 curr, builder.makeLocalGet(info.ptrLocal, indexType))),
             curr}));
        }
      }